

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish_test.cc
# Opt level: O0

void __thiscall Blowfish_ECB_Test::TestBody(Blowfish_ECB_Test *this)

{
  bool bVar1;
  EVP_CIPHER_CTX *pEVar2;
  EVP_CIPHER *pEVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_508;
  Message local_500;
  Span<const_unsigned_char> local_4f8;
  Bytes local_4e8;
  Span<const_unsigned_char> local_4d8;
  Bytes local_4c8;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_3;
  Message local_4a0;
  unsigned_long local_498;
  unsigned_long local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_458;
  Message local_450;
  int local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_410;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_3c8;
  Message local_3c0;
  int local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_380;
  Message local_378;
  int local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__4;
  ScopedEVP_CIPHER_CTX decrypt_ctx;
  Message local_2b8;
  Span<const_unsigned_char> local_2b0;
  Bytes local_2a0;
  Span<const_unsigned_char> local_290;
  Bytes local_280;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_1;
  Message local_258;
  unsigned_long local_250;
  unsigned_long local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar;
  AssertHelper local_210;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1c8;
  Message local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_180;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  string local_150;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  undefined1 local_f8 [8];
  ScopedEVP_CIPHER_CTX ctx;
  int final_bytes;
  int out_bytes;
  uint8_t out [16];
  ScopedTrace local_39;
  BlowfishTestCase *pBStack_38;
  ScopedTrace gtest_trace_67;
  BlowfishTestCase *test;
  BlowfishTestCase *__end1;
  BlowfishTestCase *__begin1;
  BlowfishTestCase (*__range1) [2];
  Blowfish_ECB_Test *pBStack_10;
  uint test_num;
  Blowfish_ECB_Test *this_local;
  
  __range1._4_4_ = 0;
  __end1 = kTests;
  pBStack_10 = this;
  while( true ) {
    if (__end1 == (BlowfishTestCase *)"17Blowfish_ECB_Test") {
      return;
    }
    pBStack_38 = __end1;
    __range1._4_4_ = __range1._4_4_ + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&local_39,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
               ,0x43,(uint *)((long)&__range1 + 4));
    bssl::internal::
    StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
    StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                    *)local_f8);
    pEVar2 = (EVP_CIPHER_CTX *)
             bssl::internal::
             StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
             get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                  *)local_f8);
    pEVar3 = EVP_bf_ecb();
    local_11c = EVP_EncryptInit_ex(pEVar2,pEVar3,(ENGINE *)0x0,pBStack_38->key,(uchar *)0x0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_118,&local_11c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_150,(internal *)local_118,
                 (AssertionResult *)
                 "EVP_EncryptInit_ex(ctx.get(), EVP_bf_ecb(), nullptr, test.key, nullptr)","false",
                 "true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x4a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      testing::Message::~Message(&local_128);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pEVar2 = (EVP_CIPHER_CTX *)
               bssl::internal::
               StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
               ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                      *)local_f8);
      local_16c = EVP_CIPHER_CTX_set_padding(pEVar2,0);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_168,&local_16c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_168,
                   (AssertionResult *)"EVP_CIPHER_CTX_set_padding(ctx.get(), 0 )","false","true",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                   ,0x4b,pcVar4);
        testing::internal::AssertHelper::operator=(&local_180,&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_178);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pEVar2 = (EVP_CIPHER_CTX *)
                 bssl::internal::
                 StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                 ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                        *)local_f8);
        local_1b4 = EVP_EncryptUpdate(pEVar2,(uchar *)&final_bytes,(int *)&ctx.ctx_.field_0x94,
                                      pBStack_38->plaintext,0x10);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_1b0,&local_1b4,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
        if (!bVar1) {
          testing::Message::Message(&local_1c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_1b0,
                     (AssertionResult *)
                     "EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext, sizeof(test.plaintext))"
                     ,"false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                     ,0x4d,pcVar4);
          testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
          testing::internal::AssertHelper::~AssertHelper(&local_1c8);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_1c0);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pEVar2 = (EVP_CIPHER_CTX *)
                   bssl::internal::
                   StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                   ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                          *)local_f8);
          local_1fc = EVP_EncryptFinal_ex(pEVar2,(uchar *)((long)&final_bytes +
                                                          (long)(int)ctx.ctx_._148_4_),
                                          &ctx.ctx_.poisoned);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1f8,&local_1fc,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
          if (!bVar1) {
            testing::Message::Message(&local_208);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_1f8,
                       (AssertionResult *)
                       "EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes)","false",
                       "true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_210,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                       ,0x4e,pcVar4);
            testing::internal::AssertHelper::operator=(&local_210,&local_208);
            testing::internal::AssertHelper::~AssertHelper(&local_210);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_208);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_248 = (unsigned_long)(ctx.ctx_._148_4_ + ctx.ctx_.poisoned);
            local_250 = 0x10;
            testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                      ((EqHelper *)local_240,"static_cast<size_t>(out_bytes + final_bytes)",
                       "sizeof(test.plaintext)",&local_248,&local_250);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
            if (!bVar1) {
              testing::Message::Message(&local_258);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                         ,0x50,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1.message_,&local_258);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_258);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
            bssl::Span<unsigned_char_const>::Span<16ul>
                      ((Span<unsigned_char_const> *)&local_290,&pBStack_38->ecb_ciphertext);
            Bytes::Bytes(&local_280,local_290);
            bssl::Span<unsigned_char_const>::Span<16ul>
                      ((Span<unsigned_char_const> *)&local_2b0,(uchar (*) [16])&final_bytes);
            Bytes::Bytes(&local_2a0,local_2b0);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_270,"Bytes(test.ecb_ciphertext)","Bytes(out)",&local_280,
                       &local_2a0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
            if (!bVar1) {
              testing::Message::Message(&local_2b8);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&decrypt_ctx.ctx_.poisoned,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                         ,0x51,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&decrypt_ctx.ctx_.poisoned,&local_2b8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&decrypt_ctx.ctx_.poisoned);
              testing::Message::~Message(&local_2b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
            bssl::internal::
            StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
            StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                            *)&gtest_ar__4.message_);
            pEVar2 = (EVP_CIPHER_CTX *)
                     bssl::internal::
                     StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                     ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                            *)&gtest_ar__4.message_);
            pEVar3 = EVP_bf_ecb();
            local_36c = EVP_DecryptInit_ex(pEVar2,pEVar3,(ENGINE *)0x0,pBStack_38->key,(uchar *)0x0)
            ;
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_368,&local_36c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
            if (!bVar1) {
              testing::Message::Message(&local_378);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__5.message_,(internal *)local_368,
                         (AssertionResult *)
                         "EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_ecb(), nullptr, test.key, nullptr)"
                         ,"false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_380,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                         ,0x55,pcVar4);
              testing::internal::AssertHelper::operator=(&local_380,&local_378);
              testing::internal::AssertHelper::~AssertHelper(&local_380);
              std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_378);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pEVar2 = (EVP_CIPHER_CTX *)
                       bssl::internal::
                       StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                       ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                              *)&gtest_ar__4.message_);
              local_3b4 = EVP_CIPHER_CTX_set_padding(pEVar2,0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_3b0,&local_3b4,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
              if (!bVar1) {
                testing::Message::Message(&local_3c0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__6.message_,(internal *)local_3b0,
                           (AssertionResult *)"EVP_CIPHER_CTX_set_padding(decrypt_ctx.get(), 0 )",
                           "false","true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_3c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                           ,0x57,pcVar4);
                testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
                testing::internal::AssertHelper::~AssertHelper(&local_3c8);
                std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_3c0);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pEVar2 = (EVP_CIPHER_CTX *)
                         bssl::internal::
                         StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                         ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                *)&gtest_ar__4.message_);
                local_3fc = EVP_DecryptUpdate(pEVar2,(uchar *)&final_bytes,
                                              (int *)&ctx.ctx_.field_0x94,pBStack_38->ecb_ciphertext
                                              ,0x10);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_3f8,&local_3fc,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_3f8);
                if (!bVar1) {
                  testing::Message::Message(&local_408);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__7.message_,(internal *)local_3f8,
                             (AssertionResult *)
                             "EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes, test.ecb_ciphertext, sizeof(test.ecb_ciphertext))"
                             ,"false","true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_410,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                             ,0x5a,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_410,&local_408);
                  testing::internal::AssertHelper::~AssertHelper(&local_410);
                  std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_408);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pEVar2 = (EVP_CIPHER_CTX *)
                           bssl::internal::
                           StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                           ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                  *)&gtest_ar__4.message_);
                  local_444 = EVP_DecryptFinal_ex(pEVar2,(uchar *)((long)&final_bytes +
                                                                  (long)(int)ctx.ctx_._148_4_),
                                                  &ctx.ctx_.poisoned);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_440,&local_444,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_440);
                  if (!bVar1) {
                    testing::Message::Message(&local_450);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_2.message_,(internal *)local_440,
                               (AssertionResult *)
                               "EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes)"
                               ,"false","true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_458,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                               ,0x5c,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_458,&local_450);
                    testing::internal::AssertHelper::~AssertHelper(&local_458);
                    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                    testing::Message::~Message(&local_450);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_490 = (unsigned_long)(ctx.ctx_._148_4_ + ctx.ctx_.poisoned);
                    local_498 = 0x10;
                    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                              ((EqHelper *)local_488,"static_cast<size_t>(out_bytes + final_bytes)",
                               "sizeof(test.plaintext)",&local_490,&local_498);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_488);
                    if (!bVar1) {
                      testing::Message::Message(&local_4a0);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_488);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                                 ,0x5e,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_3.message_,&local_4a0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_3.message_);
                      testing::Message::~Message(&local_4a0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
                    bssl::Span<unsigned_char_const>::Span<16ul>
                              ((Span<unsigned_char_const> *)&local_4d8,&pBStack_38->plaintext);
                    Bytes::Bytes(&local_4c8,local_4d8);
                    bssl::Span<unsigned_char_const>::Span<16ul>
                              ((Span<unsigned_char_const> *)&local_4f8,(uchar (*) [16])&final_bytes)
                    ;
                    Bytes::Bytes(&local_4e8,local_4f8);
                    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                              ((EqHelper *)local_4b8,"Bytes(test.plaintext)","Bytes(out)",&local_4c8
                               ,&local_4e8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4b8);
                    if (!bVar1) {
                      testing::Message::Message(&local_500);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_4b8);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_508,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                                 ,0x5f,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_508,&local_500);
                      testing::internal::AssertHelper::~AssertHelper(&local_508);
                      testing::Message::~Message(&local_500);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ = 0;
                  }
                }
              }
            }
            bssl::internal::
            StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
            ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                             *)&gtest_ar__4.message_);
          }
        }
      }
    }
    bssl::internal::
    StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
    ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                     *)local_f8);
    testing::ScopedTrace::~ScopedTrace(&local_39);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) break;
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST(Blowfish, ECB) {
  unsigned test_num = 0;
  for (const auto &test : kTests) {
    test_num++;
    SCOPED_TRACE(test_num);

    uint8_t out[sizeof(test.ecb_ciphertext)];
    int out_bytes, final_bytes;

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), EVP_bf_ecb(), nullptr, test.key,
                                   nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_set_padding(ctx.get(), 0 /* no padding */));
    ASSERT_TRUE(EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext,
                                  sizeof(test.plaintext)));
    ASSERT_TRUE(EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.ecb_ciphertext), Bytes(out));

    bssl::ScopedEVP_CIPHER_CTX decrypt_ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_ecb(), nullptr,
                                   test.key, nullptr));
    ASSERT_TRUE(
        EVP_CIPHER_CTX_set_padding(decrypt_ctx.get(), 0 /* no padding */));
    ASSERT_TRUE(EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes,
                                  test.ecb_ciphertext,
                                  sizeof(test.ecb_ciphertext)));
    ASSERT_TRUE(
        EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.plaintext), Bytes(out));
  }
}